

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimc.c
# Opt level: O0

void optimize(opt_object obj,custom_function *funcpt,custom_gradient *funcgrad,int N,double *xi,
             int method)

{
  int iVar1;
  double *dx_00;
  double dVar2;
  double *dx;
  double delta;
  double fsval;
  int local_38;
  int m;
  int i;
  int method_local;
  double *xi_local;
  int N_local;
  custom_gradient *funcgrad_local;
  custom_function *funcpt_local;
  opt_object obj_local;
  
  dx_00 = (double *)malloc((long)N << 3);
  for (local_38 = 0; local_38 < N; local_38 = local_38 + 1) {
    dx_00[local_38] = 1.0;
  }
  obj->Method = method;
  obj->Iter = 0;
  if (obj->N == N) {
    if (method == 0) {
      strcpy(obj->MethodName,"Nelder-Mead");
      iVar1 = nel_min(funcpt,xi,obj->N,dx_00,1.0,obj->MaxIter,&obj->Iter,obj->eps,obj->xopt);
      obj->retval = iVar1;
    }
    else if (method == 1) {
      strcpy(obj->MethodName,"Newton Line Search");
      iVar1 = newton_min_func(funcpt,funcgrad,xi,obj->N,dx_00,1.0,obj->maxstep,obj->MaxIter,
                              &obj->Iter,obj->eps,obj->gtol,obj->stol,obj->xopt);
      obj->retval = iVar1;
    }
    else if (method == 2) {
      strcpy(obj->MethodName,"Newton Trust Region - Hook Step");
      iVar1 = newton_min_trust(funcpt,funcgrad,xi,obj->N,dx_00,1.0,-1.0,0,obj->MaxIter,&obj->Iter,
                               obj->eps,obj->gtol,obj->stol,obj->xopt);
      obj->retval = iVar1;
    }
    else if (method == 3) {
      strcpy(obj->MethodName,"Newton Trust Region - Double Dog-Leg");
      iVar1 = newton_min_trust(funcpt,funcgrad,xi,obj->N,dx_00,1.0,-1.0,1,obj->MaxIter,&obj->Iter,
                               obj->eps,obj->gtol,obj->stol,obj->xopt);
      obj->retval = iVar1;
    }
    else if (method == 4) {
      strcpy(obj->MethodName,"Conjugate Gradient");
      iVar1 = conjgrad_min_lin(funcpt,funcgrad,xi,obj->N,dx_00,obj->maxstep,obj->MaxIter,&obj->Iter,
                               obj->eps,obj->gtol,obj->ftol,obj->xtol,obj->xopt);
      obj->retval = iVar1;
    }
    else if (method == 5) {
      strcpy(obj->MethodName,"BFGS");
      iVar1 = bfgs_min(funcpt,funcgrad,xi,obj->N,dx_00,1.0,obj->maxstep,obj->MaxIter,&obj->Iter,
                       obj->eps,obj->gtol,obj->stol,obj->xopt);
      obj->retval = iVar1;
    }
    else if (method == 6) {
      strcpy(obj->MethodName,"Limited Memory BFGS");
      iVar1 = mvalue(N);
      iVar1 = bfgs_l_min(funcpt,funcgrad,xi,obj->N,iVar1,dx_00,1.0,obj->maxstep,obj->MaxIter,
                         &obj->Iter,obj->eps,obj->gtol,obj->ftol,obj->xtol,obj->xopt);
      obj->retval = iVar1;
    }
    else {
      if (method != 7) {
        strcpy(obj->MethodName,"NULL");
        printf("Method Value should be one of 0,1,2,3,4,5 or 6. See Documentation. \n");
        exit(1);
      }
      strcpy(obj->MethodName,"BFGS More-Thuente Line Search");
      iVar1 = mvalue(N);
      iVar1 = bfgs_min2(funcpt,funcgrad,xi,obj->N,iVar1,dx_00,1.0,obj->maxstep,obj->MaxIter,
                        &obj->Iter,obj->eps,obj->gtol,obj->ftol,obj->xtol,obj->xopt);
      obj->retval = iVar1;
    }
    dVar2 = (*funcpt->funcpt)(obj->xopt,obj->N,funcpt->params);
    obj->objfunc = dVar2;
    free(dx_00);
    return;
  }
  printf("The Object is initialized for a problem of size %d \n",(ulong)(uint)obj->N);
  printf("Please Reinitialize the object for the new size %d using opt_init command \n",
         (ulong)(uint)N);
  exit(1);
}

Assistant:

void optimize(opt_object obj, custom_function *funcpt, custom_gradient *funcgrad, int N, double *xi,
		int method) {
	int i,m;
	double fsval,delta;
	double *dx;

	dx = (double*) malloc(sizeof(double) * N);
		/*
		 * Method 0 - Nelder-Mead
		 * Method 1 - Newton Line Search
		 * Method 2 - Newton Trust Region - Hook Step
		 * Method 3 - Newton Trust Region - Double Dog-Leg
		 * Method 4 - Conjugate Gradient
		 * Method 5 - BFGS
		 * Method 6 - Limited Memory BFGS
		 * Method 7 - BFGS More-Thuente Line Search
		 */
	/*
	 * Return Codes
	 *
	 * Code 1 denotes probable success.
	 * Codes 2,3 and 6 denote possible success.
	 * Codes 0, 4 and 15 denote failure. [Code 4 my also occur in cases where the minima is realized but
	 * convergence is not achieved due to tolerance values being too small. It is recommended that you use
	 * another method if you suspect that such a scenario has occurred.]
	 *
	 * 0 - Input Error
	 * 1 - df(x)/dx <= gtol achieved so current point may be the local minima.
	 * 2 - Distance between the last two steps is less than stol or |xf - xi| <= stol so the point may be the local minima.
	 * 3 - Global Step failed to locate a lower point than the current point so it may be the local minima.
	 * 4 - Iteration Limit exceeded. Convergence probably not achieved.
	 * 6 - Function value drops below ftol (relative functional tolerance).
	 * 15 - Overflow occurs. Try a different method.
	 *
	 */
	fsval = 1.0;
	delta = -1.0; // Trust Region default


	for(i = 0; i < N;++i) {
		dx[i] = 1.0;
	}
	obj->Method = method;
	obj->Iter = 0;

	if (obj->N != N) {
		printf("The Object is initialized for a problem of size %d \n",obj->N);
		printf("Please Reinitialize the object for the new size %d using opt_init command \n",N);
		exit(1);
	}

	if (method == 0) {
		strcpy(obj->MethodName,"Nelder-Mead");
		obj->retval = nel_min(funcpt,xi,obj->N,dx,fsval,obj->MaxIter,&obj->Iter,obj->eps,obj->xopt);
	} else if (method == 1) {
		strcpy(obj->MethodName,"Newton Line Search");
		obj->retval = newton_min_func(funcpt,funcgrad,xi,obj->N,dx,fsval,obj->maxstep,obj->MaxIter,&obj->Iter,obj->eps,obj->gtol,
				obj->stol,obj->xopt);
	} else if (method == 2) {
		strcpy(obj->MethodName,"Newton Trust Region - Hook Step");

		obj->retval = newton_min_trust(funcpt,funcgrad,xi,obj->N,dx,fsval,delta,0,obj->MaxIter,&obj->Iter,obj->eps,
				obj->gtol,obj->stol,obj->xopt);
	} else if (method == 3) {
		strcpy(obj->MethodName,"Newton Trust Region - Double Dog-Leg");

		obj->retval = newton_min_trust(funcpt,funcgrad,xi,obj->N,dx,fsval,delta,1,obj->MaxIter,&obj->Iter,obj->eps,
				obj->gtol,obj->stol,obj->xopt);
	} else if (method == 4) {
		strcpy(obj->MethodName,"Conjugate Gradient");

		obj->retval = conjgrad_min_lin(funcpt, funcgrad, xi, obj->N, dx, obj->maxstep, obj->MaxIter, &obj->Iter, obj->eps, obj->gtol,
				obj->ftol,obj->xtol,obj->xopt);
	} else if (method == 5) {
		strcpy(obj->MethodName,"BFGS");

		obj->retval = bfgs_min(funcpt, funcgrad, xi, obj->N, dx, fsval, obj->maxstep, obj->MaxIter, &obj->Iter, obj->eps, obj->gtol,
				obj->stol,obj->xopt);
	} else if (method == 6) {
		strcpy(obj->MethodName,"Limited Memory BFGS");
		m = mvalue(N);
		obj->retval = bfgs_l_min(funcpt, funcgrad, xi, obj->N, m, dx, fsval, obj->maxstep, obj->MaxIter, &obj->Iter, obj->eps,
				obj->gtol,obj->ftol,obj->xtol,obj->xopt);
	}
	else if (method == 7) {
		strcpy(obj->MethodName, "BFGS More-Thuente Line Search");
		m = mvalue(N);
		obj->retval = bfgs_min2(funcpt, funcgrad, xi, obj->N, m, dx, fsval, obj->maxstep, obj->MaxIter, &obj->Iter, obj->eps,
			obj->gtol, obj->ftol, obj->xtol, obj->xopt);
	}
	else {
		strcpy(obj->MethodName,"NULL");
		printf("Method Value should be one of 0,1,2,3,4,5 or 6. See Documentation. \n");
		exit(1);
	}

	obj->objfunc = FUNCPT_EVAL(funcpt,obj->xopt,obj->N);

	free(dx);
}